

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Fme7_Apu.cpp
# Opt level: O1

void __thiscall Nes_Fme7_Apu::run_until(Nes_Fme7_Apu *this,blip_time_t end_time)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  Blip_Buffer *buf;
  ulong uVar4;
  int iVar5;
  int delta;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  
  lVar8 = 0;
  do {
    buf = this->oscs[lVar8].output;
    if (buf != (Blip_Buffer *)0x0) {
      bVar2 = (this->super_fme7_apu_state_t).regs[lVar8 + 8];
      uVar9 = (uint)""[bVar2 & 0xf];
      bVar3 = (this->super_fme7_apu_state_t).regs[7];
      buf->modified_ = 1;
      if ((bVar2 & 0x10) != 0 || (bVar3 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
        uVar9 = 0;
      }
      uVar7 = (uint)(this->super_fme7_apu_state_t).regs[lVar8 * 2] << 4 |
              ((this->super_fme7_apu_state_t).regs[lVar8 * 2 + 1] & 0xf) << 0xc;
      if (uVar7 < 0x32) {
        uVar9 = 0;
      }
      if (uVar7 == 0) {
        uVar7 = 0x10;
      }
      uVar10 = uVar9;
      if ((this->super_fme7_apu_state_t).phases[lVar8] == '\0') {
        uVar10 = 0;
      }
      iVar6 = uVar10 - this->oscs[lVar8].last_amp;
      if (iVar6 != 0) {
        this->oscs[lVar8].last_amp = uVar10;
        Blip_Synth<12,_1>::offset(&this->synth,this->last_time,iVar6,buf);
      }
      iVar6 = (uint)(this->super_fme7_apu_state_t).delays[lVar8] + this->last_time;
      if (iVar6 < end_time) {
        if (uVar9 == 0) {
          uVar4 = (ulong)((end_time + -1 + uVar7) - iVar6) / (ulong)uVar7;
          puVar1 = (this->super_fme7_apu_state_t).phases + lVar8;
          *puVar1 = *puVar1 ^ (byte)uVar4 & 1;
          iVar6 = iVar6 + (int)uVar4 * uVar7;
        }
        else {
          iVar5 = uVar9 + uVar10 * -2;
          iVar11 = uVar10 * 2 - uVar9;
          do {
            delta = iVar5;
            Blip_Synth<12,_1>::offset_inline(&this->synth,iVar6,delta,buf);
            iVar6 = iVar6 + uVar7;
            iVar5 = iVar11;
            iVar11 = delta;
          } while (iVar6 < end_time);
          this->oscs[lVar8].last_amp = (int)(uVar9 + delta) >> 1;
          (this->super_fme7_apu_state_t).phases[lVar8] = 0 < delta;
        }
      }
      (this->super_fme7_apu_state_t).delays[lVar8] = (short)iVar6 - (short)end_time;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  this->last_time = end_time;
  return;
}

Assistant:

void Nes_Fme7_Apu::run_until( blip_time_t end_time )
{
	require( end_time >= last_time );
	
	for ( int index = 0; index < osc_count; index++ )
	{
		int mode = regs [7] >> index;
		int vol_mode = regs [010 + index];
		int volume = amp_table [vol_mode & 0x0F];
		
		Blip_Buffer* const osc_output = oscs [index].output;
		if ( !osc_output )
			continue;
		osc_output->set_modified();
		
		// check for unsupported mode
		#ifndef NDEBUG
			if ( (mode & 011) <= 001 && vol_mode & 0x1F )
				debug_printf( "FME7 used unimplemented sound mode: %02X, vol_mode: %02X\n",
						mode, vol_mode & 0x1F );
		#endif
		
		if ( (mode & 001) | (vol_mode & 0x10) )
			volume = 0; // noise and envelope aren't supported
		
		// period
		int const period_factor = 16;
		unsigned period = (regs [index * 2 + 1] & 0x0F) * 0x100 * period_factor +
				regs [index * 2] * period_factor;
		if ( period < 50 ) // around 22 kHz
		{
			volume = 0;
			if ( !period ) // on my AY-3-8910A, period doesn't have extra one added
				period = period_factor;
		}
		
		// current amplitude
		int amp = volume;
		if ( !phases [index] )
			amp = 0;
		{
			int delta = amp - oscs [index].last_amp;
			if ( delta )
			{
				oscs [index].last_amp = amp;
				synth.offset( last_time, delta, osc_output );
			}
		}
		
		blip_time_t time = last_time + delays [index];
		if ( time < end_time )
		{
			int delta = amp * 2 - volume;
			if ( volume )
			{
				do
				{
					delta = -delta;
					synth.offset_inline( time, delta, osc_output );
					time += period;
				}
				while ( time < end_time );
				
				oscs [index].last_amp = (delta + volume) >> 1;
				phases [index] = (delta > 0);
			}
			else
			{
				// maintain phase when silent
				int count = (end_time - time + period - 1) / period;
				phases [index] ^= count & 1;
				time += (blargg_long) count * period;
			}
		}
		
		delays [index] = time - end_time;
	}
	
	last_time = end_time;
}